

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libpopcnt.h
# Opt level: O3

int get_cpuid(void)

{
  long lVar1;
  uint uVar2;
  uint in_XCR0;
  
  uVar2 = 0;
  lVar1 = cpuid_Version_info(1);
  if ((*(uint *)(lVar1 + 0xc) >> 0x1b & 1) != 0) {
    uVar2 = *(uint *)(lVar1 + 0xc) & 0x800000;
    if ((~in_XCR0 & 6) == 0) {
      lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar2 = *(uint *)(lVar1 + 4) & 0x20 | uVar2;
      if ((~in_XCR0 & 0xe6) == 0) {
        uVar2 = uVar2 | *(uint *)(lVar1 + 4) & 0x40000000;
      }
    }
  }
  return uVar2;
}

Assistant:

static inline int get_cpuid()
{
  int flags = 0;
  int abcd[4];

  run_cpuid(1, 0, abcd);

  if ((abcd[2] & bit_POPCNT) == bit_POPCNT)
    flags |= bit_POPCNT;

#if defined(HAVE_AVX2) || \
    defined(HAVE_AVX512)

  int osxsave_mask = (1 << 27);

  /* ensure OS supports extended processor state management */
  if ((abcd[2] & osxsave_mask) != osxsave_mask)
    return 0;

  int ymm_mask = XSTATE_SSE | XSTATE_YMM;
  int zmm_mask = XSTATE_SSE | XSTATE_YMM | XSTATE_ZMM;

  int xcr0 = get_xcr0();

  if ((xcr0 & ymm_mask) == ymm_mask)
  {
    run_cpuid(7, 0, abcd);

    if ((abcd[1] & bit_AVX2) == bit_AVX2)
      flags |= bit_AVX2;

    if ((xcr0 & zmm_mask) == zmm_mask)
    {
      if ((abcd[1] & bit_AVX512) == bit_AVX512)
        flags |= bit_AVX512;
    }
  }

#endif

  return flags;
}